

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Rand(MP<135UL,_GF2::MOLex<135UL>_> *this)

{
  bool bVar1;
  u32 uVar2;
  MM<135UL> m;
  WW<135UL> WStack_28;
  
  std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::clear
            (&this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>);
  WW<135UL>::SetAllZero(&WStack_28);
  do {
    uVar2 = Env::Rand();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::insert
                (&this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>,
                 (this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
                 super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next,(value_type *)&WStack_28);
    }
    bVar1 = WW<135UL>::Next(&WStack_28,false);
  } while (bVar1);
  return this;
}

Assistant:

MP& Rand()
	{
		SetEmpty();
		MM<_n> m;
		do if (Env::Rand() & 1)
			insert(begin(), m);
		while (_order.Next(m));
		return *this;
	}